

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_unordered.hpp
# Opt level: O3

void __thiscall
boost::unordered::detail::foa::
table_core<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::parsing::ParserMetadata::Node>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::syntax::SyntaxNode_*,_void>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::parsing::ParserMetadata::Node>_>_>
::table_core(table_core<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::parsing::ParserMetadata::Node>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::syntax::SyntaxNode_*,_void>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::parsing::ParserMetadata::Node>_>_>
             *this,table_core<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::parsing::ParserMetadata::Node>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::syntax::SyntaxNode_*,_void>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::parsing::ParserMetadata::Node>_>_>
                   *x,
            allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::parsing::ParserMetadata::Node>_>
            *al_)

{
  ulong uVar1;
  ulong uVar2;
  float fVar3;
  undefined1 local_11;
  
  fVar3 = ceilf((float)(x->size_ctrl).size / 0.875);
  table_arrays<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::parsing::ParserMetadata::Node>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::parsing::ParserMetadata::Node>_>_>
  ::new_(this,&local_11,(long)(fVar3 - 9.223372e+18) & (long)fVar3 >> 0x3f | (long)fVar3);
  uVar1 = (this->arrays).groups_size_mask * 0xf + 0xe;
  if ((this->arrays).elements_ == (value_type_pointer)0x0) {
    uVar1 = 0;
  }
  uVar2 = (ulong)((float)uVar1 * 0.875);
  uVar2 = (long)((float)uVar1 * 0.875 - 9.223372e+18) & (long)uVar2 >> 0x3f | uVar2;
  if (uVar1 < 0x1e) {
    uVar2 = uVar1;
  }
  (this->size_ctrl).ml = uVar2;
  (this->size_ctrl).size = 0;
  copy_elements_from(this,x);
  return;
}

Assistant:

table_core(const table_core& x, const Allocator& al_) :
        table_core{std::size_t(std::ceil(float(x.size()) / mlf)), x.h(), x.pred(), al_} {
        copy_elements_from(x);
    }